

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O3

void __thiscall
dg::vr::ValueRelations::RelatedValueIterator::nextViableValue(RelatedValueIterator *this)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  cVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&(this->vr->bucketToVals)._M_t,(this->bucketIt)._M_node + 1);
  p_Var4 = (_Base_ptr)(this->valueIt)._M_current;
  if (p_Var4 == cVar2._M_node[1]._M_left) {
    do {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((this->bucketIt)._M_node);
      (this->bucketIt)._M_node = p_Var3;
      if ((_Rb_tree_header *)p_Var3 == &(this->related)._M_t._M_impl.super__Rb_tree_header) {
        this->isEnd = true;
        return;
      }
      cVar2 = std::
              _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              ::find(&(this->vr->bucketToVals)._M_t,p_Var3 + 1);
      (this->valueIt)._M_current = (Value **)cVar2._M_node[1]._M_parent;
      cVar2 = std::
              _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
              ::find(&(this->vr->bucketToVals)._M_t,(this->bucketIt)._M_node + 1);
      p_Var4 = (_Base_ptr)(this->valueIt)._M_current;
    } while (p_Var4 == cVar2._M_node[1]._M_left);
  }
  p_Var1 = (this->bucketIt)._M_node[1]._M_parent;
  (this->current).first = *(Value **)p_Var4;
  (this->current).second.bits.super__Base_bitset<1UL>._M_w = (_WordT)p_Var1;
  return;
}

Assistant:

void nextViableValue() {
            while (valueIt == getCurrentEqual().end()) {
                ++bucketIt;
                if (bucketIt == related.end()) {
                    isEnd = true;
                    return;
                }
                valueIt = getCurrentEqual().begin();
            }
            updateCurrent();
        }